

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O1

void __thiscall siamese::EncoderPacketWindow::ClearWindow(EncoderPacketWindow *this)

{
  EncoderColumnLane *pEVar1;
  undefined1 auVar2 [16];
  long lVar3;
  undefined4 in_ECX;
  uint *puVar4;
  undefined1 auVar5 [16];
  
  this->Count = 0;
  this->LongestPacket = 0;
  this->FirstUnremovedElement = 0;
  this->SumStartElement = 0;
  this->SumEndElement = 0;
  puVar4 = &this->Lanes[0].LongestPacket;
  lVar3 = 0;
  auVar2 = vpmovsxbd_avx(ZEXT416(0x30201000));
  do {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = puVar4;
    vpscatterdd_avx512vl
              (auVar5 + ZEXT816(0xffffffffffffffd8) + auVar2,
               (ulong)CONCAT31((int3)((uint)in_ECX >> 8),7),(undefined1  [16])0x0);
    auVar5 = vpbroadcastd_avx512vl();
    pEVar1 = (EncoderColumnLane *)(puVar4 + -0x10);
    auVar5 = vmovdqu32_avx512vl(auVar5);
    pEVar1->NextElement[0] = auVar5._0_4_;
    pEVar1->NextElement[1] = auVar5._4_4_;
    pEVar1->NextElement[2] = auVar5._8_4_;
    *(int *)&pEVar1->field_0xc = auVar5._12_4_;
    *puVar4 = 0;
    lVar3 = lVar3 + 1;
    puVar4 = puVar4 + 0x12;
  } while (lVar3 != 8);
  return;
}

Assistant:

void EncoderPacketWindow::ClearWindow()
{
    FirstUnremovedElement = 0;
    Count                 = 0;
    LongestPacket         = 0;
    SumStartElement       = 0;
    SumEndElement         = 0;

    for (unsigned laneIndex = 0; laneIndex < kColumnLaneCount; ++laneIndex)
    {
        EncoderColumnLane& lane = Lanes[laneIndex];

        for (unsigned sumIndex = 0; sumIndex < kColumnSumCount; ++sumIndex)
        {
            lane.Sum[sumIndex].Bytes   = 0;
            lane.NextElement[sumIndex] = laneIndex;
        }
        lane.LongestPacket = 0;
    }
}